

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsFirstDeriv
          (BeagleCPUImpl<double,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int firstDerivativeIndex,int categoryWeightsIndex,int stateFrequenciesIndex,
          int scalingFactorsIndex,double *outSumLogLikelihood,double *outSumFirstDerivative)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  int *piVar19;
  double *pdVar20;
  double *pdVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  double *pdVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  double *pdVar30;
  long lVar31;
  int iVar32;
  ulong uVar33;
  double __x;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  pdVar14 = this->gPartials[parIndex];
  pdVar15 = this->gTransitionMatrices[probIndex];
  pdVar16 = this->gTransitionMatrices[firstDerivativeIndex];
  pdVar17 = this->gCategoryWeights[categoryWeightsIndex];
  pdVar18 = this->gStateFrequencies[stateFrequenciesIndex];
  memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  memset(this->firstDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  if ((childIndex < this->kTipCount) &&
     (piVar19 = this->gTipStates[childIndex], piVar19 != (int *)0x0)) {
    iVar32 = this->kCategoryCount;
    if (0 < (long)iVar32) {
      uVar10 = this->kPatternCount;
      uVar11 = this->kStateCount;
      iVar12 = this->kMatrixSize;
      iVar13 = this->kPartialsPaddedStateCount;
      lVar25 = 0;
      iVar23 = 0;
      lVar27 = 0;
      do {
        if (0 < (int)uVar10) {
          auVar35._8_8_ = 0;
          auVar35._0_8_ = pdVar17[lVar25];
          pdVar26 = this->integrationTmp;
          pdVar20 = this->firstDerivTmp;
          iVar24 = this->kTransPaddedStateCount;
          lVar27 = (long)(int)lVar27;
          pdVar30 = pdVar14 + lVar27;
          uVar28 = 0;
          iVar22 = 0;
          do {
            if (0 < (int)uVar11) {
              lVar31 = (long)piVar19[uVar28] + (long)iVar23;
              uVar33 = 0;
              do {
                auVar1._8_8_ = 0;
                auVar1._0_8_ = pdVar26[(long)iVar22 + uVar33];
                auVar40._8_8_ = 0;
                auVar40._0_8_ = pdVar15[lVar31] * pdVar30[uVar33];
                auVar36 = vfmadd213sd_fma(auVar40,auVar35,auVar1);
                pdVar26[(long)iVar22 + uVar33] = auVar36._0_8_;
                auVar2._8_8_ = 0;
                auVar2._0_8_ = pdVar20[(long)iVar22 + uVar33];
                auVar41._8_8_ = 0;
                auVar41._0_8_ = pdVar16[lVar31] * pdVar30[uVar33];
                auVar36 = vfmadd213sd_fma(auVar41,auVar35,auVar2);
                pdVar20[(long)iVar22 + uVar33] = auVar36._0_8_;
                uVar33 = uVar33 + 1;
                lVar31 = lVar31 + iVar24;
              } while (uVar11 != uVar33);
              iVar22 = iVar22 + (int)uVar33;
            }
            lVar27 = lVar27 + iVar13;
            uVar28 = uVar28 + 1;
            pdVar30 = pdVar30 + iVar13;
          } while (uVar28 != uVar10);
        }
        lVar25 = lVar25 + 1;
        iVar23 = iVar23 + iVar12;
      } while (lVar25 != iVar32);
    }
  }
  else {
    iVar32 = this->kCategoryCount;
    if (0 < (long)iVar32) {
      pdVar30 = this->gPartials[childIndex];
      iVar12 = this->kPatternCount;
      uVar10 = this->kStateCount;
      iVar13 = this->kMatrixSize;
      iVar23 = this->kPartialsPaddedStateCount;
      iVar24 = 0;
      lVar25 = 0;
      lVar27 = 0;
      do {
        if (0 < iVar12) {
          auVar36._8_8_ = 0;
          auVar36._0_8_ = pdVar17[lVar25];
          pdVar20 = this->integrationTmp;
          pdVar21 = this->firstDerivTmp;
          lVar27 = (long)(int)lVar27;
          pdVar26 = pdVar30 + lVar27;
          iVar22 = 0;
          lVar31 = 0;
          do {
            if (0 < (int)uVar10) {
              lVar31 = (long)(int)lVar31;
              uVar28 = 0;
              iVar29 = iVar24;
              do {
                auVar35 = ZEXT816(0) << 0x40;
                uVar33 = 0;
                auVar43 = ZEXT816(0) << 0x40;
                do {
                  auVar48._8_8_ = 0;
                  auVar48._0_8_ = pdVar26[uVar33];
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = pdVar15[(long)iVar29 + uVar33];
                  auVar43 = vfmadd231sd_fma(auVar43,auVar48,auVar3);
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = pdVar16[(long)iVar29 + uVar33];
                  auVar35 = vfmadd231sd_fma(auVar35,auVar48,auVar4);
                  uVar33 = uVar33 + 1;
                } while (uVar10 != uVar33);
                auVar5._8_8_ = 0;
                auVar5._0_8_ = pdVar20[lVar31];
                auVar46._8_8_ = 0;
                auVar46._0_8_ = auVar43._0_8_ * pdVar14[lVar27 + uVar28];
                auVar43 = vfmadd213sd_fma(auVar46,auVar36,auVar5);
                pdVar20[lVar31] = auVar43._0_8_;
                auVar43._8_8_ = 0;
                auVar43._0_8_ = pdVar21[lVar31];
                auVar42._8_8_ = 0;
                auVar42._0_8_ = auVar35._0_8_ * pdVar14[lVar27 + uVar28];
                auVar43 = vfmadd213sd_fma(auVar42,auVar36,auVar43);
                pdVar21[lVar31] = auVar43._0_8_;
                lVar31 = lVar31 + 1;
                uVar28 = uVar28 + 1;
                iVar29 = iVar29 + uVar10 + 1;
              } while (uVar28 != uVar10);
            }
            lVar27 = lVar27 + iVar23;
            iVar22 = iVar22 + 1;
            pdVar26 = pdVar26 + iVar23;
          } while (iVar22 != iVar12);
        }
        lVar25 = lVar25 + 1;
        iVar24 = iVar24 + iVar13;
      } while (lVar25 != iVar32);
    }
  }
  uVar28 = (ulong)(uint)this->kPatternCount;
  if (0 < this->kPatternCount) {
    lVar25 = 0;
    iVar32 = 0;
    do {
      iVar12 = this->kStateCount;
      if ((long)iVar12 < 1) {
        __x = 0.0;
        dVar39 = 0.0;
      }
      else {
        auVar43 = ZEXT816(0);
        lVar27 = 0;
        auVar36 = ZEXT816(0);
        do {
          auVar47._8_8_ = 0;
          auVar47._0_8_ = pdVar18[lVar27];
          auVar6._8_8_ = 0;
          auVar6._0_8_ = this->integrationTmp[iVar32 + lVar27];
          auVar36 = vfmadd231sd_fma(auVar36,auVar47,auVar6);
          __x = auVar36._0_8_;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = this->firstDerivTmp[iVar32 + lVar27];
          auVar43 = vfmadd231sd_fma(auVar43,auVar47,auVar7);
          dVar39 = auVar43._0_8_;
          lVar27 = lVar27 + 1;
        } while (iVar12 != lVar27);
        iVar32 = iVar32 + iVar12;
      }
      dVar34 = log(__x);
      this->outLogLikelihoodsTmp[lVar25] = dVar34;
      this->outFirstDerivativesTmp[lVar25] = dVar39 / __x;
      lVar25 = lVar25 + 1;
      uVar28 = (ulong)this->kPatternCount;
    } while (lVar25 < (long)uVar28);
  }
  if ((scalingFactorsIndex != -1) && (0 < (int)uVar28)) {
    pdVar14 = this->gScaleBuffers[scalingFactorsIndex];
    pdVar15 = this->outLogLikelihoodsTmp;
    uVar33 = 0;
    do {
      pdVar15[uVar33] = pdVar14[uVar33] + pdVar15[uVar33];
      uVar33 = uVar33 + 1;
    } while ((uVar28 & 0xffffffff) != uVar33);
  }
  *outSumLogLikelihood = 0.0;
  *outSumFirstDerivative = 0.0;
  if (0 < (int)uVar28) {
    pdVar14 = this->gPatternWeights;
    pdVar15 = this->outLogLikelihoodsTmp;
    pdVar16 = this->outFirstDerivativesTmp;
    uVar33 = 0;
    do {
      auVar37._8_8_ = 0;
      auVar37._0_8_ = pdVar15[uVar33];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = pdVar14[uVar33];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *outSumLogLikelihood;
      auVar36 = vfmadd213sd_fma(auVar44,auVar37,auVar8);
      *outSumLogLikelihood = auVar36._0_8_;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = pdVar16[uVar33];
      auVar45._8_8_ = 0;
      auVar45._0_8_ = pdVar14[uVar33];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *outSumFirstDerivative;
      auVar36 = vfmadd213sd_fma(auVar45,auVar38,auVar9);
      *outSumFirstDerivative = auVar36._0_8_;
      uVar33 = uVar33 + 1;
    } while ((uVar28 & 0xffffffff) != uVar33);
  }
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsFirstDeriv(const int parIndex,
                                                               const int childIndex,
                                                               const int probIndex,
                                                               const int firstDerivativeIndex,
                                                               const int categoryWeightsIndex,
                                                               const int stateFrequenciesIndex,
                                                               const int scalingFactorsIndex,
                                                               double* outSumLogLikelihood,
                                                               double* outSumFirstDerivative) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(firstDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJ = 0.0;
                    double sumOverJD1 = 0.0;
                    for(int j = 0; j < kStateCount; j++) {
                        sumOverJ += transMatrix[w] * partialsChild[v + j];
                        sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                        w++;
                    }

                    // increment for the extra column at the end
                    w += T_PAD;

                    integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                    u++;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        REALTYPE sumOverID1 = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            sumOverID1 += freqs[i] * firstDerivTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
        outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    *outSumFirstDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];

        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}